

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

string * amrex::VisMF::BaseName(string *__return_storage_ptr__,string *filename)

{
  char *pcVar1;
  allocator local_11;
  
  pcVar1 = strrchr((filename->_M_dataplus)._M_p,0x2f);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1 + 1,&local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
VisMF::BaseName (const std::string& filename)
{
    BL_ASSERT(filename[filename.length() - 1] != '/');

    if(const char *slash = strrchr(filename.c_str(), '/')) {
        //
        // Got at least one slash -- return the following tail.
        //
        return std::string(slash + 1);
    } else {
        //
        // No leading directory portion to name.
        //
        return filename;
    }
}